

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

iterator __thiscall
phmap::priv::
btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_>
::insert(btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_>
         *this,value_type *x)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
  *pbVar2;
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
  bVar3;
  pointer pcVar4;
  undefined1 auVar5 [12];
  _Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*,_false>
  x_00;
  node_type *pnVar6;
  btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
  bVar7;
  _Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*>
  _Var8;
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
  *pbVar9;
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
  **ppbVar10;
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
  **ppbVar11;
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
  **ppbVar12;
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
  *pbVar13;
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
  bVar14;
  byte bVar15;
  char *__function;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **args;
  allocator_type *extraout_RDX;
  allocator_type *paVar16;
  allocator_type *extraout_RDX_00;
  allocator_type *extraout_RDX_01;
  allocator_type *extraout_RDX_02;
  size_type extraout_RDX_03;
  size_type sVar17;
  long lVar18;
  ulong uVar19;
  size_type i;
  allocator_type *in_R9;
  ulong uVar20;
  _Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*,_false>
  this_00;
  string *psVar21;
  ulong i_00;
  size_type n;
  bool bVar22;
  iterator iVar23;
  iterator iVar24;
  iterator local_60;
  _Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*,_false>
  local_50;
  btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
  *local_48;
  node_type *local_40;
  btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
  *local_38;
  
  if ((this->
      super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_>
      ).tree_.size_ == 0) {
    _Var8.
    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*,_false>
    ._M_head_impl =
         (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*,_false>
          )btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
           ::new_leaf_root_node
                     ((btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                       *)this,1);
    (this->
    super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_>
    ).tree_.rightmost_ =
         (node_type *)
         _Var8.
         super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*,_false>
         ._M_head_impl;
    (this->
    super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_>
    ).tree_.root_.
    super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*>
    .
    super__Tuple_impl<1UL,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*>
    .
    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*>
    .
    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*,_false>
         = _Var8.
           super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*,_false>
           ._M_head_impl;
  }
  iVar23 = btree<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
           ::internal_upper_bound<std::__cxx11::string>
                     ((btree<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
                       *)this,x);
  auVar5 = iVar23._0_12_;
  if (iVar23.node ==
      (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
       *)0x0) {
    iVar23 = btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
             ::end((btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                    *)this);
    auVar5 = iVar23._0_12_;
  }
  local_60.node = auVar5._0_8_;
  local_60.position = auVar5._8_4_;
  pbVar9 = local_60.node;
  if ((auVar5 & (undefined1  [12])0x7) == (undefined1  [12])0x0) {
    if (local_60.node[0xb] ==
        (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
         )0x0) {
      if (local_60.position < 0) {
        __assert_fail("position >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x994,
                      "void phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::NonTransparentCompare, std::allocator<std::basic_string<char>>, 256, true>>, std::basic_string<char> &, std::basic_string<char> *>::decrement_slow() [Node = phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::NonTransparentCompare, std::allocator<std::basic_string<char>>, 256, true>>, Reference = std::basic_string<char> &, Pointer = std::basic_string<char> *]"
                     );
      }
      pbVar9 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
               ::child(local_60.node,(ulong)(uint)local_60.position);
      local_60.node = pbVar9;
      for (; ((ulong)pbVar9 & 7) == 0;
          pbVar9 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                   ::child(pbVar9,(ulong)(byte)pbVar9[10])) {
        if (pbVar9[0xb] !=
            (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
             )0x0) {
          local_60.position = (int)(byte)pbVar9[10];
          local_60.node = pbVar9;
          goto LAB_001a2154;
        }
      }
    }
    else {
LAB_001a2154:
      pbVar9 = local_60.node;
      if (((ulong)local_60.node & 7) == 0) {
        args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x7;
        if (local_60.node[0xb] !=
            (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
             )0x0) {
          args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                 (ulong)(byte)local_60.node[0xb];
        }
        bVar14 = SUB81(args,0);
        if (local_60.node[10] == bVar14) {
          if ((byte)bVar14 < 7) {
            if (local_60.node !=
                ((btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                  *)(this->
                    super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_>
                    ).tree_.root_.
                    super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*>
                    .
                    super__Tuple_impl<1UL,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*>
                    .
                    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*>
                    .
                    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*,_false>
                )._M_head_impl) {
              __assert_fail("iter.node == root()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0xc27,
                            "iterator phmap::priv::btree<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::NonTransparentCompare, std::allocator<std::basic_string<char>>, 256, true>>::internal_emplace(iterator, Args &&...) [Params = phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::NonTransparentCompare, std::allocator<std::basic_string<char>>, 256, true>, Args = <std::basic_string<char>>]"
                           );
            }
            bVar15 = 7;
            if ((byte)((char)bVar14 * '\x02') < 7) {
              bVar15 = (char)bVar14 * '\x02';
            }
            local_60.node =
                 btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                 ::new_leaf_root_node
                           ((btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                             *)this,(uint)bVar15);
            pbVar9 = local_60.node;
            if ((((ulong)local_60.node & 7) != 0) ||
               (_Var8.
                super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*,_false>
                ._M_head_impl =
                     (this->
                     super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_>
                     ).tree_.root_.
                     super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*>
                     .
                     super__Tuple_impl<1UL,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*,_false>
               , ((ulong)_Var8.
                         super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*,_false>
                         ._M_head_impl & 7) != 0)) goto LAB_001a212d;
            if ((local_60.node[0xb] != (node_type)0x0) !=
                (*(btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                   *)((long)_Var8.
                            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*,_false>
                            ._M_head_impl + 0xb) !=
                (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                 )0x0)) {
              __assert_fail("leaf() == x->leaf()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0x942,
                            "void phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::NonTransparentCompare, std::allocator<std::basic_string<char>>, 256, true>>::swap(btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::NonTransparentCompare, std::allocator<std::basic_string<char>>, 256, true>]"
                           );
            }
            this_00._M_head_impl = local_60.node;
            x_00 = _Var8.
                   super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*,_false>
                   ._M_head_impl;
            if ((byte)local_60.node[10] <=
                (byte)*(btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                        *)((long)_Var8.
                                 super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*,_false>
                                 ._M_head_impl + 10)) {
              this_00 = _Var8.
                        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*,_false>
                        ._M_head_impl;
              x_00._M_head_impl = local_60.node;
            }
            local_50 = _Var8.
                       super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*,_false>
                       ._M_head_impl;
            local_48 = (btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                        *)this;
            local_40 = local_60.node;
            if (x_00._M_head_impl[10] !=
                (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                 )0x0) {
              lVar18 = (ulong)(byte)x_00._M_head_impl[10] << 5;
              pbVar9 = x_00._M_head_impl + 0x10;
              do {
                std::__cxx11::string::swap((string *)pbVar9);
                pbVar9 = (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                          *)((string *)pbVar9 + 0x20);
                lVar18 = lVar18 + -0x20;
              } while (lVar18 != 0);
            }
            bVar14 = this_00._M_head_impl[10];
            bVar3 = x_00._M_head_impl[10];
            uVar19 = (ulong)(byte)bVar3;
            n = (byte)bVar14 - uVar19;
            btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
            ::uninitialized_move_n(this_00._M_head_impl,n,uVar19,uVar19,x_00._M_head_impl,in_R9);
            if (bVar14 != bVar3) {
              i = (size_type)(byte)x_00._M_head_impl[10];
              paVar16 = extraout_RDX;
              do {
                btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                ::value_destroy(this_00._M_head_impl,i,paVar16);
                i = i + 1;
                n = n - 1;
                paVar16 = extraout_RDX_00;
              } while (n != 0);
            }
            pnVar6 = local_40;
            if (local_40[0xb] == (node_type)0x0) {
              ppbVar10 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                         ::mutable_child(x_00._M_head_impl,0);
              ppbVar11 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                         ::mutable_child(x_00._M_head_impl,(ulong)(byte)x_00._M_head_impl[10] + 1);
              ppbVar12 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                         ::mutable_child(this_00._M_head_impl,0);
              for (; ppbVar10 != ppbVar11; ppbVar10 = ppbVar10 + 1) {
                pbVar9 = *ppbVar10;
                *ppbVar10 = *ppbVar12;
                *ppbVar12 = pbVar9;
                ppbVar12 = ppbVar12 + 1;
              }
              uVar20 = 0;
              do {
                uVar19 = uVar20;
                pbVar9 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                         ::child(x_00._M_head_impl,uVar19);
                if (((ulong)pbVar9 & 7) != 0) {
LAB_001a24b0:
                  __function = 
                  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::NonTransparentCompare, std::allocator<std::basic_string<char>>, 256, true>> *, unsigned char, std::basic_string<char>, phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::NonTransparentCompare, std::allocator<std::basic_string<char>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::NonTransparentCompare, std::allocator<std::basic_string<char>>, 256, true>> *, unsigned char, std::basic_string<char>, phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::NonTransparentCompare, std::allocator<std::basic_string<char>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = char]"
                  ;
                  goto LAB_001a24c5;
                }
                *(btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                  **)pbVar9 = x_00._M_head_impl;
                pbVar9 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                         ::child(this_00._M_head_impl,uVar19);
                if (((ulong)pbVar9 & 7) != 0) goto LAB_001a24b0;
                *(btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                  **)pbVar9 = this_00._M_head_impl;
                uVar20 = uVar19 + 1;
              } while (uVar19 < (byte)x_00._M_head_impl[10]);
              if (uVar19 < (byte)this_00._M_head_impl[10]) {
                do {
                  pbVar9 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                           ::child(this_00._M_head_impl,uVar20);
                  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                  ::init_child(x_00._M_head_impl,(int)uVar20,pbVar9);
                  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                  ::mutable_child(this_00._M_head_impl,uVar20);
                  uVar19 = (ulong)(byte)this_00._M_head_impl[10];
                  bVar22 = uVar20 < uVar19;
                  uVar20 = uVar20 + 1;
                } while (bVar22);
              }
            }
            this = (btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_>
                    *)local_48;
            bVar14 = pnVar6[10];
            args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                   CONCAT71((int7)(uVar19 >> 8),local_50._M_head_impl[10]);
            pnVar6[10] = local_50._M_head_impl[10];
            local_50._M_head_impl[10] = bVar14;
            btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
            ::delete_leaf_node(local_48,(local_48->root_).
                                        super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*>
                                        .
                                        super__Tuple_impl<1UL,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*>
                                        .
                                        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*>
                                        .
                                        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*,_false>
                                        ._M_head_impl);
            (((btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
               *)this)->root_).
            super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*>
            .
            super__Tuple_impl<1UL,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*>
            .
            super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*>
            .
            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*,_false>
            ._M_head_impl = local_60.node;
            ((btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
              *)this)->rightmost_ = local_60.node;
          }
          else {
            btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
            ::rebalance_or_split
                      ((btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                        *)this,&local_60);
          }
        }
        pbVar9 = local_60.node;
        if (((ulong)local_60.node & 7) == 0) {
          uVar20 = (ulong)local_60.position;
          uVar19 = (ulong)(byte)*(btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
                                  *)(local_60.node + 10);
          if (uVar19 < uVar20) {
            __assert_fail("i <= count()",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0x852,
                          "void phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::NonTransparentCompare, std::allocator<std::basic_string<char>>, 256, true>>::emplace_value(const size_type, allocator_type *, Args &&...) [Params = phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::NonTransparentCompare, std::allocator<std::basic_string<char>>, 256, true>, Args = <std::basic_string<char>>]"
                         );
          }
          if (uVar20 < uVar19) {
            local_38 = (btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
                        *)(local_60.node +
                          (ulong)(byte)*(btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
                                         *)(local_60.node + 10) * 0x20 + -0x10);
            btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
            ::value_init<std::__cxx11::string*>
                      ((btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
                        *)local_60.node,uVar19,(allocator_type *)&local_38,args);
            uVar19 = (ulong)(byte)*(btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
                                    *)(pbVar9 + 10) - 1;
            paVar16 = extraout_RDX_01;
            if (uVar20 < uVar19) {
              psVar21 = (string *)
                        (pbVar9 + (ulong)(byte)*(btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
                                                 *)(pbVar9 + 10) * 0x20 + -0x30);
              do {
                std::__cxx11::string::operator=(psVar21 + 0x20,psVar21);
                uVar19 = uVar19 - 1;
                psVar21 = psVar21 + -0x20;
                paVar16 = extraout_RDX_02;
              } while (uVar20 < uVar19);
            }
            btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
            ::value_destroy(pbVar9,uVar20,paVar16);
          }
          lVar18 = uVar20 * 0x20;
          pbVar2 = (btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
                    *)(pbVar9 + lVar18 + 0x20);
          *(btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
            **)(pbVar2 + -0x10) = pbVar2;
          pcVar4 = (x->_M_dataplus)._M_p;
          paVar1 = &x->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 == paVar1) {
            sVar17 = *(size_type *)((long)&x->field_2 + 8);
            *(size_type *)pbVar2 = paVar1->_M_allocated_capacity;
            *(size_type *)(pbVar2 + 8) = sVar17;
          }
          else {
            *(pointer *)(pbVar9 + lVar18 + 0x10) = pcVar4;
            *(size_type *)(pbVar9 + lVar18 + 0x20) = paVar1->_M_allocated_capacity;
          }
          sVar17 = x->_M_string_length;
          *(size_type *)(pbVar9 + lVar18 + 0x18) = sVar17;
          (x->_M_dataplus)._M_p = (pointer)paVar1;
          x->_M_string_length = 0;
          (x->field_2)._M_local_buf[0] = '\0';
          bVar7 = (btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
                   )((char)*(btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
                             *)(pbVar9 + 10) + 1);
          pbVar13 = (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                     *)CONCAT71((int7)((ulong)(pbVar9 + lVar18 + 0x10) >> 8),bVar7);
          *(btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
            *)(pbVar9 + 10) = bVar7;
          if (*(btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
                *)(pbVar9 + 0xb) ==
              (btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
               )0x0) {
            uVar20 = uVar20 + 1;
            uVar19 = (ulong)(byte)bVar7;
            if (uVar20 < (byte)bVar7) {
              while ((int)uVar20 < (int)uVar19) {
                i_00 = (ulong)((int)uVar19 - 1);
                pbVar13 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                          ::child(pbVar9,i_00);
                btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                ::set_child(pbVar9,uVar19,pbVar13);
                uVar19 = i_00;
              }
              pbVar13 = (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                         *)btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                           ::mutable_child(pbVar9,uVar20);
              sVar17 = extraout_RDX_03;
            }
          }
          ((btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
            *)this)->size_ =
               ((btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                 *)this)->size_ + 1;
          iVar24._8_8_ = sVar17;
          iVar24.node = pbVar13;
          return iVar24;
        }
      }
    }
  }
LAB_001a212d:
  local_60.node = pbVar9;
  __function = 
  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::NonTransparentCompare, std::allocator<std::basic_string<char>>, 256, true>> *, unsigned char, std::basic_string<char>, phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::NonTransparentCompare, std::allocator<std::basic_string<char>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::NonTransparentCompare, std::allocator<std::basic_string<char>>, 256, true>> *, unsigned char, std::basic_string<char>, phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::NonTransparentCompare, std::allocator<std::basic_string<char>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
  ;
LAB_001a24c5:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,__function);
}

Assistant:

iterator insert(value_type &&x) {
            return this->tree_.insert_multi(std::move(x));
        }